

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrload.c
# Opt level: O1

FT_Error pfr_aux_name_load(FT_Byte *p,FT_UInt len,FT_Memory memory,FT_String **astring)

{
  uint in_EAX;
  ulong uVar1;
  FT_String *__dest;
  ulong __n;
  uint uVar2;
  FT_Error error;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  if (*astring != (FT_String *)0x0) {
    ft_mem_free(memory,*astring);
    *astring = (FT_String *)0x0;
  }
  if (len == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = len - (p[(long)(int)len + -1] == '\0');
  }
  if (uVar2 != 0) {
    __n = (ulong)uVar2;
    __dest = (FT_String *)0x0;
    uVar1 = 0;
    do {
      if ((char)p[uVar1] < ' ') goto LAB_0014a79d;
      uVar1 = uVar1 + 1;
    } while (__n != uVar1);
    if (uVar2 != 0) {
      __dest = (FT_String *)
               ft_mem_alloc(memory,(ulong)(uVar2 + 1),(FT_Error *)((long)&uStack_38 + 4));
      if (uStack_38._4_4_ == 0) {
        memcpy(__dest,p,__n);
        __dest[__n] = '\0';
      }
      goto LAB_0014a79d;
    }
  }
  __dest = (FT_String *)0x0;
LAB_0014a79d:
  *astring = __dest;
  return uStack_38._4_4_;
}

Assistant:

static FT_Error
  pfr_aux_name_load( FT_Byte*     p,
                     FT_UInt      len,
                     FT_Memory    memory,
                     FT_String*  *astring )
  {
    FT_Error    error  = FT_Err_Ok;
    FT_String*  result = NULL;
    FT_UInt     n, ok;


    if ( *astring )
      FT_FREE( *astring );

    if ( len > 0 && p[len - 1] == 0 )
      len--;

    /* check that each character is ASCII  */
    /* for making sure not to load garbage */
    ok = ( len > 0 );
    for ( n = 0; n < len; n++ )
      if ( p[n] < 32 || p[n] > 127 )
      {
        ok = 0;
        break;
      }

    if ( ok )
    {
      if ( FT_ALLOC( result, len + 1 ) )
        goto Exit;

      FT_MEM_COPY( result, p, len );
      result[len] = 0;
    }

  Exit:
    *astring = result;
    return error;
  }